

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glwInitFunctions.cpp
# Opt level: O2

void glw::initExtensionsES(Functions *gl,FunctionLoader *loader,int numExtensions,char **extensions)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extSet;
  allocator<char> local_69;
  key_type local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<char_const*const*>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_48,extensions,extensions + numExtensions);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_KHR_blend_equation_advanced",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBlendBarrierKHR");
    gl->blendBarrier = (glBlendBarrierFunc)CONCAT44(extraout_var,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"GL_KHR_debug",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDebugMessageCallbackKHR");
    gl->debugMessageCallback = (glDebugMessageCallbackFunc)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDebugMessageControlKHR");
    gl->debugMessageControl = (glDebugMessageControlFunc)CONCAT44(extraout_var_01,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDebugMessageInsertKHR");
    gl->debugMessageInsert = (glDebugMessageInsertFunc)CONCAT44(extraout_var_02,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetDebugMessageLogKHR");
    gl->getDebugMessageLog = (glGetDebugMessageLogFunc)CONCAT44(extraout_var_03,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetObjectLabelKHR");
    gl->getObjectLabel = (glGetObjectLabelFunc)CONCAT44(extraout_var_04,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetObjectPtrLabelKHR");
    gl->getObjectPtrLabel = (glGetObjectPtrLabelFunc)CONCAT44(extraout_var_05,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetPointervKHR");
    gl->getPointerv = (glGetPointervFunc)CONCAT44(extraout_var_06,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glObjectLabelKHR");
    gl->objectLabel = (glObjectLabelFunc)CONCAT44(extraout_var_07,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glObjectPtrLabelKHR");
    gl->objectPtrLabel = (glObjectPtrLabelFunc)CONCAT44(extraout_var_08,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPopDebugGroupKHR");
    gl->popDebugGroup = (glPopDebugGroupFunc)CONCAT44(extraout_var_09,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPushDebugGroupKHR");
    gl->pushDebugGroup = (glPushDebugGroupFunc)CONCAT44(extraout_var_10,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_KHR_robustness",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetGraphicsResetStatusKHR");
    gl->getGraphicsResetStatus = (glGetGraphicsResetStatusFunc)CONCAT44(extraout_var_11,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetnUniformfvKHR");
    gl->getnUniformfv = (glGetnUniformfvFunc)CONCAT44(extraout_var_12,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetnUniformivKHR");
    gl->getnUniformiv = (glGetnUniformivFunc)CONCAT44(extraout_var_13,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetnUniformuivKHR");
    gl->getnUniformuiv = (glGetnUniformuivFunc)CONCAT44(extraout_var_14,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glReadnPixelsKHR");
    gl->readnPixels = (glReadnPixelsFunc)CONCAT44(extraout_var_15,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_tessellation_shader",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPatchParameteriEXT");
    gl->patchParameteri = (glPatchParameteriFunc)CONCAT44(extraout_var_16,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_geometry_shader",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTextureEXT");
    gl->framebufferTexture = (glFramebufferTextureFunc)CONCAT44(extraout_var_17,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_robustness",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetGraphicsResetStatusEXT");
    gl->getGraphicsResetStatus = (glGetGraphicsResetStatusFunc)CONCAT44(extraout_var_18,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetnUniformfvEXT");
    gl->getnUniformfv = (glGetnUniformfvFunc)CONCAT44(extraout_var_19,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetnUniformivEXT");
    gl->getnUniformiv = (glGetnUniformivFunc)CONCAT44(extraout_var_20,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glReadnPixelsEXT");
    gl->readnPixels = (glReadnPixelsFunc)CONCAT44(extraout_var_21,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_texture_buffer",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexBufferEXT");
    gl->texBuffer = (glTexBufferFunc)CONCAT44(extraout_var_22,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexBufferRangeEXT");
    gl->texBufferRange = (glTexBufferRangeFunc)CONCAT44(extraout_var_23,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_primitive_bounding_box",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPrimitiveBoundingBoxEXT");
    gl->primitiveBoundingBox = (glPrimitiveBoundingBoxFunc)CONCAT44(extraout_var_24,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_copy_image",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glCopyImageSubDataEXT");
    gl->copyImageSubData = (glCopyImageSubDataFunc)CONCAT44(extraout_var_25,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_draw_buffers_indexed",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBlendEquationSeparateiEXT");
    gl->blendEquationSeparatei = (glBlendEquationSeparateiFunc)CONCAT44(extraout_var_26,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBlendEquationiEXT");
    gl->blendEquationi = (glBlendEquationiFunc)CONCAT44(extraout_var_27,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBlendFuncSeparateiEXT");
    gl->blendFuncSeparatei = (glBlendFuncSeparateiFunc)CONCAT44(extraout_var_28,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBlendFunciEXT");
    gl->blendFunci = (glBlendFunciFunc)CONCAT44(extraout_var_29,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glColorMaskiEXT");
    gl->colorMaski = (glColorMaskiFunc)CONCAT44(extraout_var_30,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDisableiEXT");
    gl->disablei = (glDisableiFunc)CONCAT44(extraout_var_31,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glEnableiEXT");
    gl->enablei = (glEnableiFunc)CONCAT44(extraout_var_32,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glIsEnablediEXT");
    gl->isEnabledi = (glIsEnablediFunc)CONCAT44(extraout_var_33,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_draw_elements_base_vertex",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDrawElementsBaseVertexEXT");
    gl->drawElementsBaseVertex = (glDrawElementsBaseVertexFunc)CONCAT44(extraout_var_34,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDrawElementsInstancedBaseVertexEXT");
    gl->drawElementsInstancedBaseVertex =
         (glDrawElementsInstancedBaseVertexFunc)CONCAT44(extraout_var_35,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDrawRangeElementsBaseVertexEXT");
    gl->drawRangeElementsBaseVertex =
         (glDrawRangeElementsBaseVertexFunc)CONCAT44(extraout_var_36,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glMultiDrawElementsBaseVertexEXT");
    gl->multiDrawElementsBaseVertex =
         (glMultiDrawElementsBaseVertexFunc)CONCAT44(extraout_var_37,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_texture_storage",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexStorage1DEXT");
    gl->texStorage1DEXT = (glTexStorage1DEXTFunc)CONCAT44(extraout_var_38,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexStorage2DEXT");
    gl->texStorage2DEXT = (glTexStorage2DEXTFunc)CONCAT44(extraout_var_39,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexStorage3DEXT");
    gl->texStorage3DEXT = (glTexStorage3DEXTFunc)CONCAT44(extraout_var_40,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTextureStorage1DEXT");
    gl->textureStorage1DEXT = (glTextureStorage1DEXTFunc)CONCAT44(extraout_var_41,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTextureStorage2DEXT");
    gl->textureStorage2DEXT = (glTextureStorage2DEXTFunc)CONCAT44(extraout_var_42,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTextureStorage3DEXT");
    gl->textureStorage3DEXT = (glTextureStorage3DEXTFunc)CONCAT44(extraout_var_43,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_texture_border_clamp",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetSamplerParameterIivEXT");
    gl->getSamplerParameterIiv = (glGetSamplerParameterIivFunc)CONCAT44(extraout_var_44,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetSamplerParameterIuivEXT");
    gl->getSamplerParameterIuiv = (glGetSamplerParameterIuivFunc)CONCAT44(extraout_var_45,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameterIivEXT");
    gl->getTexParameterIiv = (glGetTexParameterIivFunc)CONCAT44(extraout_var_46,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetTexParameterIuivEXT");
    gl->getTexParameterIuiv = (glGetTexParameterIuivFunc)CONCAT44(extraout_var_47,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glSamplerParameterIivEXT");
    gl->samplerParameterIiv = (glSamplerParameterIivFunc)CONCAT44(extraout_var_48,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glSamplerParameterIuivEXT");
    gl->samplerParameterIuiv = (glSamplerParameterIuivFunc)CONCAT44(extraout_var_49,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterIivEXT");
    gl->texParameterIiv = (glTexParameterIivFunc)CONCAT44(extraout_var_50,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexParameterIuivEXT");
    gl->texParameterIuiv = (glTexParameterIuivFunc)CONCAT44(extraout_var_51,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_EXT_debug_marker",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glInsertEventMarkerEXT");
    gl->insertEventMarkerEXT = (glInsertEventMarkerEXTFunc)CONCAT44(extraout_var_52,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPopGroupMarkerEXT");
    gl->popGroupMarkerEXT = (glPopGroupMarkerEXTFunc)CONCAT44(extraout_var_53,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glPushGroupMarkerEXT");
    gl->pushGroupMarkerEXT = (glPushGroupMarkerEXTFunc)CONCAT44(extraout_var_54,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_EGL_image",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glEGLImageTargetRenderbufferStorageOES");
    gl->eglImageTargetRenderbufferStorageOES =
         (glEGLImageTargetRenderbufferStorageOESFunc)CONCAT44(extraout_var_55,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glEGLImageTargetTexture2DOES");
    gl->eglImageTargetTexture2DOES =
         (glEGLImageTargetTexture2DOESFunc)CONCAT44(extraout_var_56,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_texture_3D",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexImage3DOES");
    gl->compressedTexImage3DOES = (glCompressedTexImage3DOESFunc)CONCAT44(extraout_var_57,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glCompressedTexSubImage3DOES");
    gl->compressedTexSubImage3DOES =
         (glCompressedTexSubImage3DOESFunc)CONCAT44(extraout_var_58,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glCopyTexSubImage3DOES");
    gl->copyTexSubImage3DOES = (glCopyTexSubImage3DOESFunc)CONCAT44(extraout_var_59,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glFramebufferTexture3DOES");
    gl->framebufferTexture3DOES = (glFramebufferTexture3DOESFunc)CONCAT44(extraout_var_60,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexImage3DOES");
    gl->texImage3DOES = (glTexImage3DOESFunc)CONCAT44(extraout_var_61,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexSubImage3DOES");
    gl->texSubImage3DOES = (glTexSubImage3DOESFunc)CONCAT44(extraout_var_62,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_texture_storage_multisample_2d_array",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glTexStorage3DMultisampleOES");
    gl->texStorage3DMultisample = (glTexStorage3DMultisampleFunc)CONCAT44(extraout_var_63,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_sample_shading",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glMinSampleShadingOES");
    gl->minSampleShading = (glMinSampleShadingFunc)CONCAT44(extraout_var_64,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_mapbuffer",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetBufferPointervOES");
    gl->getBufferPointerv = (glGetBufferPointervFunc)CONCAT44(extraout_var_65,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glMapBufferOES");
    gl->mapBuffer = (glMapBufferFunc)CONCAT44(extraout_var_66,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glUnmapBufferOES");
    gl->unmapBuffer = (glUnmapBufferFunc)CONCAT44(extraout_var_67,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_vertex_array_object",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glBindVertexArrayOES");
    gl->bindVertexArray = (glBindVertexArrayFunc)CONCAT44(extraout_var_68,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDeleteVertexArraysOES");
    gl->deleteVertexArrays = (glDeleteVertexArraysFunc)CONCAT44(extraout_var_69,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGenVertexArraysOES");
    gl->genVertexArrays = (glGenVertexArraysFunc)CONCAT44(extraout_var_70,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glIsVertexArrayOES");
    gl->isVertexArray = (glIsVertexArrayFunc)CONCAT44(extraout_var_71,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_OES_viewport_array",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDepthRangeArrayfvOES");
    gl->depthRangeArrayfvOES = (glDepthRangeArrayfvOESFunc)CONCAT44(extraout_var_72,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDepthRangeIndexedfOES");
    gl->depthRangeIndexedfOES = (glDepthRangeIndexedfOESFunc)CONCAT44(extraout_var_73,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glDisableiOES");
    gl->disablei = (glDisableiFunc)CONCAT44(extraout_var_74,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glEnableiOES");
    gl->enablei = (glEnableiFunc)CONCAT44(extraout_var_75,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetFloati_vOES");
    gl->getFloati_v = (glGetFloati_vFunc)CONCAT44(extraout_var_76,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glIsEnablediOES");
    gl->isEnabledi = (glIsEnablediFunc)CONCAT44(extraout_var_77,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glScissorArrayvOES");
    gl->scissorArrayv = (glScissorArrayvFunc)CONCAT44(extraout_var_78,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glScissorIndexedOES");
    gl->scissorIndexed = (glScissorIndexedFunc)CONCAT44(extraout_var_79,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glScissorIndexedvOES");
    gl->scissorIndexedv = (glScissorIndexedvFunc)CONCAT44(extraout_var_80,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glViewportArrayvOES");
    gl->viewportArrayv = (glViewportArrayvFunc)CONCAT44(extraout_var_81,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glViewportIndexedfOES");
    gl->viewportIndexedf = (glViewportIndexedfFunc)CONCAT44(extraout_var_82,iVar2);
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glViewportIndexedfvOES");
    gl->viewportIndexedfv = (glViewportIndexedfvFunc)CONCAT44(extraout_var_83,iVar2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_NV_internalformat_sample_query",&local_69);
  bVar1 = de::
          contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar1) {
    iVar2 = (**loader->_vptr_FunctionLoader)(loader,"glGetInternalformatSampleivNV");
    gl->getInternalformatSampleivNV =
         (glGetInternalformatSampleivNVFunc)CONCAT44(extraout_var_84,iVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

void initExtensionsES (Functions* gl, const FunctionLoader* loader, int numExtensions, const char* const* extensions)
{
	using std::string;
	using std::set;

	const set<string> extSet(extensions, extensions+numExtensions);

#include "glwInitExtES.inl"

}